

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O0

void __thiscall
Fl_Paged_Device::print_widget(Fl_Paged_Device *this,Fl_Widget *widget,int delta_x,int delta_y)

{
  byte c;
  uint uVar1;
  int iVar2;
  int h;
  undefined4 extraout_var;
  Fl_Window *pFVar3;
  undefined4 extraout_var_00;
  Fl_Plugin *pFVar4;
  bool bVar5;
  Fl_Device_Plugin *pi;
  Fl_Plugin_Manager pm;
  int drawn_by_plugin;
  int iStack_30;
  uchar old_damage;
  int is_window;
  int new_y;
  int new_x;
  int old_y;
  int old_x;
  int delta_y_local;
  int delta_x_local;
  Fl_Widget *widget_local;
  Fl_Paged_Device *this_local;
  
  old_y = delta_y;
  old_x = delta_x;
  _delta_y_local = widget;
  widget_local = (Fl_Widget *)this;
  uVar1 = Fl_Widget::visible(widget);
  if (uVar1 != 0) {
    iVar2 = (*_delta_y_local->_vptr_Fl_Widget[8])();
    bVar5 = CONCAT44(extraout_var,iVar2) != 0;
    c = Fl_Widget::damage(_delta_y_local);
    Fl_Widget::damage(_delta_y_local,0x80);
    (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[9])(this,&new_x,&new_y);
    is_window = new_x + old_x;
    iStack_30 = new_y + old_y;
    if (!bVar5) {
      iVar2 = Fl_Widget::x(_delta_y_local);
      is_window = is_window - iVar2;
      iVar2 = Fl_Widget::y(_delta_y_local);
      iStack_30 = iStack_30 - iVar2;
    }
    if ((is_window != new_x) || (iStack_30 != new_y)) {
      (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xc])
                (this,(ulong)(uint)(is_window - new_x),(ulong)(uint)(iStack_30 - new_y));
    }
    if ((bVar5) && (pFVar3 = Fl_Widget::window(_delta_y_local), pFVar3 == (Fl_Window *)0x0)) {
      iVar2 = Fl_Widget::w(_delta_y_local);
      h = Fl_Widget::h(_delta_y_local);
      fl_push_clip(0,0,iVar2,h);
    }
    pm.super_Fl_Preferences.rootNode._4_4_ = 0;
    iVar2 = (*_delta_y_local->_vptr_Fl_Widget[9])();
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&pi,"fltk:device");
      pFVar4 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&pi,"opengl.device.fltk.org");
      if (pFVar4 != (Fl_Plugin *)0x0) {
        pm.super_Fl_Preferences.rootNode._4_4_ =
             (*pFVar4->_vptr_Fl_Plugin[4])(pFVar4,_delta_y_local,0,0);
      }
      Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&pi);
    }
    if (pm.super_Fl_Preferences.rootNode._4_4_ == 0) {
      (*_delta_y_local->_vptr_Fl_Widget[2])();
    }
    if ((bVar5) && (pFVar3 = Fl_Widget::window(_delta_y_local), pFVar3 == (Fl_Window *)0x0)) {
      fl_pop_clip();
    }
    traverse(this,_delta_y_local);
    if ((is_window != new_x) || (iStack_30 != new_y)) {
      (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xd])();
    }
    if ((c & 1) == 0) {
      Fl_Widget::clear_damage(_delta_y_local,c);
    }
    else {
      Fl_Widget::damage(_delta_y_local,0x80);
    }
  }
  return;
}

Assistant:

void Fl_Paged_Device::print_widget(Fl_Widget* widget, int delta_x, int delta_y) 
{ 
  int old_x, old_y, new_x, new_y, is_window;
  if ( ! widget->visible() ) return;
  is_window = (widget->as_window() != NULL);
  uchar old_damage = widget->damage();
  widget->damage(FL_DAMAGE_ALL);
  // set origin to the desired top-left position of the widget
  origin(&old_x, &old_y);
  new_x = old_x + delta_x;
  new_y = old_y + delta_y;
  if (!is_window) {
    new_x -= widget->x();
    new_y -= widget->y();
  }
  if (new_x != old_x || new_y != old_y) {
    translate(new_x - old_x, new_y - old_y );
  }
  // if widget is a main window, clip all drawings to the window area
  if (is_window && !widget->window()) {
    fl_push_clip(0, 0, widget->w(), widget->h() );
#ifdef __APPLE__ // for Mac OS X 10.6 and above, make window with rounded bottom corners
    if ( fl_mac_os_version >= 100600 && driver()->class_name() == Fl_Quartz_Graphics_Driver::class_id ) {
      Fl_X::clip_to_rounded_corners(fl_gc, widget->w(), widget->h());
    }
#endif
  }
  // we do some trickery to recognize OpenGL windows and draw them via a plugin
  int drawn_by_plugin = 0;
  if (widget->as_gl_window()) {
    Fl_Plugin_Manager pm("fltk:device");  
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (pi) {
      drawn_by_plugin = pi->print(widget, 0, 0, 0);
    }
  }
  if (!drawn_by_plugin) {
    widget->draw();
  }
  if (is_window && !widget->window()) fl_pop_clip();
  // find subwindows of widget and print them
  traverse(widget);
  // reset origin to where it was
  if (new_x != old_x || new_y != old_y) {
    untranslate();
  }
  if ((old_damage & FL_DAMAGE_CHILD) == 0) widget->clear_damage(old_damage);
  else widget->damage(FL_DAMAGE_ALL);
}